

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void hexdump(void *start,size_t size)

{
  undefined8 *puVar1;
  ulong uVar2;
  
  puVar1 = (undefined8 *)g_string_new("");
  uVar2 = 0;
  while( true ) {
    if ((uVar2 & 0xf) == 0) {
      if (puVar1[1] != 0) {
        g_log("rifiuti2",0x80,"%s",*puVar1);
        puVar1 = (undefined8 *)g_string_assign(puVar1,"");
      }
      g_string_append_printf(puVar1,"%04zX    ",uVar2);
    }
    if (size == uVar2) break;
    g_string_append_printf(puVar1,"%02X ",*(undefined1 *)((long)start + uVar2));
    uVar2 = uVar2 + 1;
  }
  g_string_free(puVar1,1);
  return;
}

Assistant:

void
hexdump    (void     *start,
            size_t    size)
{
    GString *s = g_string_new ("");
    size_t i = 0;
    while (true)
    {
        if (i % 16 == 0)
        {
            if (s->len > 0)
            {
                g_debug ("%s", s->str);
                s = g_string_assign (s, "");
            }
            g_string_append_printf (s, "%04zX    ", i);
        }
        if (i >= size)
            break;
        g_string_append_printf (s, "%02" PRIX8 " ", *(uint8_t *) (start+i));
        i++;
    }

    g_string_free (s, TRUE);
}